

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestChildExtensionData::~TestChildExtensionData(TestChildExtensionData *this)

{
  TestChildExtensionData *this_local;
  
  SharedDtor((MessageLite *)this);
  google::protobuf::Message::~Message(&this->super_Message);
  return;
}

Assistant:

TestChildExtensionData::~TestChildExtensionData() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestChildExtensionData)
  SharedDtor(*this);
}